

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

string * __thiscall
VulkanHppGenerator::generateThrowResultException_abi_cxx11_
          (string *__return_storage_ptr__,VulkanHppGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  size_type __n;
  string *__return_storage_ptr___00;
  bool bVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  undefined8 uVar9;
  char *this_00;
  _Base_ptr valueName;
  _Alloc_hider __s;
  size_type __n_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  string strippedValue;
  string throwTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string cases;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  _Base_ptr local_1a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  size_type *local_d8;
  size_type local_d0;
  size_type local_c8;
  undefined8 uStack_c0;
  long *local_b8;
  size_type local_b0;
  long local_a8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string *local_78;
  VulkanHppGenerator *local_70;
  _Base_ptr local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_198.first._M_dataplus._M_p = (pointer)&local_198.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"VkResult","");
  local_1a0 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
              ::find(&(this->m_enums)._M_t,&local_198.first);
  local_78 = __return_storage_ptr__;
  local_70 = this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.first._M_dataplus._M_p != &local_198.first.field_2) {
    operator_delete(local_198.first._M_dataplus._M_p,
                    local_198.first.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  p_Var2 = local_1a0 + 5;
  local_68 = local_1a0[5]._M_right;
  if (p_Var2->_M_left != local_68) {
    local_1a0 = local_1a0 + 1;
    paVar1 = &local_158.field_2;
    valueName = p_Var2->_M_left + 2;
    do {
      if ((char)valueName[2]._M_color == _S_black) {
        local_198.first._M_string_length = *(size_type *)valueName;
        local_198.first._M_dataplus._M_p = (pointer)valueName->_M_parent;
        this_00 = "VK_ERROR";
        bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_198,"VK_ERROR"
                          );
        if (bVar4) {
          generateProtection(&local_198,(VulkanHppGenerator *)this_00,(string *)(valueName + 1),true
                            );
          generateEnumValueName(&local_1e0,local_70,(string *)local_1a0,(string *)valueName,false);
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_118,local_198.first._M_dataplus._M_p,
                     local_198.first._M_dataplus._M_p + local_198.first._M_string_length);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&local_118,"      case Result::");
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_118,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar6->_M_dataplus)._M_p;
          paVar7 = &pbVar6->field_2;
          if (paVar8 == paVar7) {
            local_f8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          }
          else {
            local_f8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_f8._M_dataplus._M_p = (pointer)paVar8;
          }
          local_f8._M_string_length = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_f8,": throw ");
          local_158._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
          paVar8 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p == paVar8) {
            local_158.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_158.field_2._8_4_ = *(undefined4 *)((long)&pbVar6->field_2 + 8);
            local_158.field_2._12_4_ = *(undefined4 *)((long)&pbVar6->field_2 + 0xc);
            local_158._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_158.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          }
          local_158._M_string_length = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          local_b8 = local_a8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"eError","");
          local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_200,local_1e0._M_dataplus._M_p,
                     local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
          __n = local_b0;
          __n_00 = local_200._M_string_length;
          __s._M_p = local_200._M_dataplus._M_p;
          if ((local_b0 <= local_200._M_string_length) &&
             ((local_b0 == 0 ||
              (iVar5 = bcmp(local_200._M_dataplus._M_p,local_b8,local_b0), iVar5 == 0)))) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      (&local_200,0,__n);
            __s._M_p = local_200._M_dataplus._M_p;
            __n_00 = local_200._M_string_length;
          }
          uVar9 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != paVar1) {
            uVar9 = local_158.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar9 < local_158._M_string_length + __n_00) {
            uVar9 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__s._M_p != &local_200.field_2) {
              uVar9 = local_200.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar9 < local_158._M_string_length + __n_00) goto LAB_00123379;
            pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::replace(&local_200,0,0,local_158._M_dataplus._M_p,local_158._M_string_length)
            ;
          }
          else {
LAB_00123379:
            pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::_M_append(&local_158,__s._M_p,__n_00);
          }
          local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar6->_M_dataplus)._M_p;
          paVar8 = &pbVar6->field_2;
          if (paVar7 == paVar8) {
            local_1c0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_1c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          }
          else {
            local_1c0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_1c0._M_dataplus._M_p = (pointer)paVar7;
          }
          local_1c0._M_string_length = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
          pbVar6->_M_string_length = 0;
          paVar8->_M_local_buf[0] = '\0';
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_1c0,"Error( message );\n");
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar6->_M_dataplus)._M_p;
          paVar7 = &pbVar6->field_2;
          if (paVar8 == paVar7) {
            local_138.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          }
          else {
            local_138.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_138._M_dataplus._M_p = (pointer)paVar8;
          }
          local_138._M_string_length = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_138,local_198.second._M_dataplus._M_p,
                             local_198.second._M_string_length);
          local_d8 = (size_type *)(pbVar6->_M_dataplus)._M_p;
          paVar8 = &pbVar6->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8 == paVar8) {
            local_c8 = paVar8->_M_allocated_capacity;
            uStack_c0 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
            local_d8 = &local_c8;
          }
          else {
            local_c8 = paVar8->_M_allocated_capacity;
          }
          local_d0 = pbVar6->_M_string_length;
          (pbVar6->_M_dataplus)._M_p = (pointer)paVar8;
          pbVar6->_M_string_length = 0;
          (pbVar6->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_98,(char *)local_d8,local_d0);
          if (local_d8 != &local_c8) {
            operator_delete(local_d8,local_c8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
            operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
          }
          if (local_b8 != local_a8) {
            operator_delete(local_b8,local_a8[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != paVar1) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198.second._M_dataplus._M_p != &local_198.second.field_2) {
            operator_delete(local_198.second._M_dataplus._M_p,
                            local_198.second.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198.first._M_dataplus._M_p != &local_198.first.field_2) {
            operator_delete(local_198.first._M_dataplus._M_p,
                            local_198.first.field_2._M_allocated_capacity + 1);
          }
        }
      }
      p_Var3 = valueName + 3;
      valueName = (_Base_ptr)&valueName[5]._M_left;
    } while ((_Base_ptr)&p_Var3->_M_left != local_68);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
            (&local_98);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e0,
             "\n  namespace detail\n  {\n    [[noreturn]] VULKAN_HPP_INLINE void throwResultException( Result result, char const * message )\n    {\n      switch ( result )\n      {\n${cases}\n        default: throw SystemError( make_error_code( result ), message );\n      }\n    }\n  }"
             ,"");
  __return_storage_ptr___00 = local_78;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_198,(char (*) [6])"cases",&local_98);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_198;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_60,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_d8,(allocator_type *)&local_138);
  replaceWithMap(__return_storage_ptr___00,&local_1e0,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.second._M_dataplus._M_p != &local_198.second.field_2) {
    operator_delete(local_198.second._M_dataplus._M_p,
                    local_198.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.first._M_dataplus._M_p != &local_198.first.field_2) {
    operator_delete(local_198.first._M_dataplus._M_p,
                    local_198.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr___00;
}

Assistant:

std::string VulkanHppGenerator::generateThrowResultException() const
{
  auto enumIt = m_enums.find( "VkResult" );

  std::string cases;
  for ( auto const & value : enumIt->second.values )
  {
    if ( value.supported && value.name.starts_with( "VK_ERROR" ) )
    {
      const auto [enter, leave] = generateProtection( value.protect );
      std::string valueName     = generateEnumValueName( enumIt->first, value.name, false );
      cases += enter + "      case Result::" + valueName + ": throw " + stripPrefix( valueName, "eError" ) + "Error( message );\n" + leave;
    }
  }
  cases.pop_back();  // remove last newline

  const std::string throwTemplate = R"(
  namespace detail
  {
    [[noreturn]] VULKAN_HPP_INLINE void throwResultException( Result result, char const * message )
    {
      switch ( result )
      {
${cases}
        default: throw SystemError( make_error_code( result ), message );
      }
    }
  })";
  return replaceWithMap( throwTemplate, { { "cases", cases } } );
}